

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm.c
# Opt level: O0

double * setup_tpm(double *tpm,int b,inform_error *err)

{
  ulong local_30;
  size_t i;
  inform_error *err_local;
  double *pdStack_18;
  int b_local;
  double *tpm_local;
  
  if (tpm == (double *)0x0) {
    pdStack_18 = (double *)calloc((long)(b * b),8);
    if (pdStack_18 == (double *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      return (double *)0x0;
    }
  }
  else {
    for (local_30 = 0; pdStack_18 = tpm, local_30 < (ulong)(long)(b * b); local_30 = local_30 + 1) {
      tpm[local_30] = 0.0;
    }
  }
  return pdStack_18;
}

Assistant:

inline static double *setup_tpm(double *tpm, int b, inform_error *err)
{
    if (tpm == NULL)
    {
        tpm = calloc(b * b, sizeof(double));
        if (tpm == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }
    else
    {
        for (size_t i = 0; i < (size_t)(b * b); ++i)
        {
            tpm[i] = 0.0;
        }
    }
    return tpm;
}